

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O1

UBool __thiscall
icu_63::NFSubstitution::doParse
          (NFSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,double baseValue,
          double upperBound,UBool lenientParse,uint32_t nonNumericalExecutedRuleMask,
          Formattable *result)

{
  DecimalFormat *pDVar1;
  NumberFormat *pNVar2;
  bool bVar3;
  double upperBound_00;
  double dVar4;
  double d;
  UErrorCode status_1;
  UErrorCode status;
  UErrorCode local_38;
  UErrorCode local_34;
  
  (*(this->super_UObject)._vptr_UObject[0xc])(upperBound);
  if (this->ruleSet == (NFRuleSet *)0x0) {
    pDVar1 = this->numberFormat;
    if (pDVar1 != (DecimalFormat *)0x0) {
      (*(pDVar1->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x14])
                (pDVar1,text,result,parsePosition);
    }
  }
  else {
    NFRuleSet::parse(this->ruleSet,text,parsePosition,upperBound_00,nonNumericalExecutedRuleMask,
                     result);
    if (((lenientParse != '\0') && (this->ruleSet->fIsFractionRuleSet == '\0')) &&
       (parsePosition->index == 0)) {
      local_34 = U_ZERO_ERROR;
      pNVar2 = NumberFormat::createInstance(&local_34);
      if (local_34 < U_ILLEGAL_ARGUMENT_ERROR) {
        (*(pNVar2->super_Format).super_UObject._vptr_UObject[0x14])
                  (pNVar2,text,result,parsePosition);
      }
      if (pNVar2 != (NumberFormat *)0x0) {
        (*(pNVar2->super_Format).super_UObject._vptr_UObject[1])(pNVar2);
      }
    }
  }
  bVar3 = parsePosition->index == 0;
  if (bVar3) {
    Formattable::setLong(result,0);
  }
  else {
    local_38 = U_ZERO_ERROR;
    dVar4 = Formattable::getDouble(result,&local_38);
    (*(this->super_UObject)._vptr_UObject[0xb])(dVar4,baseValue,this);
    Formattable::setDouble(result,d);
  }
  return !bVar3;
}

Assistant:

UBool
NFSubstitution::doParse(const UnicodeString& text,
                        ParsePosition& parsePosition,
                        double baseValue,
                        double upperBound,
                        UBool lenientParse,
                        uint32_t nonNumericalExecutedRuleMask,
                        Formattable& result) const
{
#ifdef RBNF_DEBUG
    fprintf(stderr, "<nfsubs> %x bv: %g ub: %g\n", this, baseValue, upperBound);
#endif
    // figure out the highest base value a rule can have and match
    // the text being parsed (this varies according to the type of
    // substitutions: multiplier, modulus, and numerator substitutions
    // restrict the search to rules with base values lower than their
    // own; same-value substitutions leave the upper bound wherever
    // it was, and the others allow any rule to match
    upperBound = calcUpperBound(upperBound);

    // use our rule set to parse the text.  If that fails and
    // lenient parsing is enabled (this is always false if the
    // formatter's lenient-parsing mode is off, but it may also
    // be false even when the formatter's lenient-parse mode is
    // on), then also try parsing the text using a default-
    // constructed NumberFormat
    if (ruleSet != NULL) {
        ruleSet->parse(text, parsePosition, upperBound, nonNumericalExecutedRuleMask, result);
        if (lenientParse && !ruleSet->isFractionRuleSet() && parsePosition.getIndex() == 0) {
            UErrorCode status = U_ZERO_ERROR;
            NumberFormat* fmt = NumberFormat::createInstance(status);
            if (U_SUCCESS(status)) {
                fmt->parse(text, result, parsePosition);
            }
            delete fmt;
        }

        // ...or use our DecimalFormat to parse the text
    } else if (numberFormat != NULL) {
        numberFormat->parse(text, result, parsePosition);
    }

    // if the parse was successful, we've already advanced the caller's
    // parse position (this is the one function that doesn't have one
    // of its own).  Derive a parse result and return it as a Long,
    // if possible, or a Double
    if (parsePosition.getIndex() != 0) {
        UErrorCode status = U_ZERO_ERROR;
        double tempResult = result.getDouble(status);

        // composeRuleValue() produces a full parse result from
        // the partial parse result passed to this function from
        // the caller (this is either the owning rule's base value
        // or the partial result obtained from composing the
        // owning rule's base value with its other substitution's
        // parse result) and the partial parse result obtained by
        // matching the substitution (which will be the same value
        // the caller would get by parsing just this part of the
        // text with RuleBasedNumberFormat.parse() ).  How the two
        // values are used to derive the full parse result depends
        // on the types of substitutions: For a regular rule, the
        // ultimate result is its multiplier substitution's result
        // times the rule's divisor (or the rule's base value) plus
        // the modulus substitution's result (which will actually
        // supersede part of the rule's base value).  For a negative-
        // number rule, the result is the negative of its substitution's
        // result.  For a fraction rule, it's the sum of its two
        // substitution results.  For a rule in a fraction rule set,
        // it's the numerator substitution's result divided by
        // the rule's base value.  Results from same-value substitutions
        // propagate back upard, and null substitutions don't affect
        // the result.
        tempResult = composeRuleValue(tempResult, baseValue);
        result.setDouble(tempResult);
        return TRUE;
        // if the parse was UNsuccessful, return 0
    } else {
        result.setLong(0);
        return FALSE;
    }
}